

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::KeyCode>::writeValueTo
          (TypedAttribute<Imf_2_5::KeyCode> *this,OStream *os,int version)

{
  int iVar1;
  KeyCode *this_00;
  
  this_00 = &this->_value;
  iVar1 = KeyCode::filmMfcCode(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::filmType(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::prefix(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::count(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::perfOffset(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::perfsPerFrame(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  iVar1 = KeyCode::perfsPerCount(this_00);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,iVar1);
  return;
}

Assistant:

void
KeyCodeAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.filmMfcCode());
    Xdr::write <StreamIO> (os, _value.filmType());
    Xdr::write <StreamIO> (os, _value.prefix());
    Xdr::write <StreamIO> (os, _value.count());
    Xdr::write <StreamIO> (os, _value.perfOffset());
    Xdr::write <StreamIO> (os, _value.perfsPerFrame());
    Xdr::write <StreamIO> (os, _value.perfsPerCount());
}